

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O1

CURLcode cf_haproxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  dynbuf *s;
  int *piVar1;
  void *pvVar2;
  CURLcode CVar3;
  size_t len;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  _Bool _Var8;
  CURLcode result;
  ip_quadruple ipquad;
  CURLcode local_a8;
  int local_a4;
  Curl_cfilter *local_a0;
  ip_quadruple local_94;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  piVar1 = (int *)cf->ctx;
  local_a8 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (local_a8 != CURLE_OK) {
    return local_a8;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  CVar3 = CURLE_OK;
  if (*piVar1 == 1) {
LAB_00114782:
    local_a8 = CVar3;
    s = (dynbuf *)(piVar1 + 2);
    len = Curl_dyn_len(s);
    if (len != 0) {
      local_a0 = cf->next;
      pcVar4 = Curl_dyn_ptr(s);
      sVar5 = Curl_conn_cf_send(local_a0,data,pcVar4,len,false,&local_a8);
      if ((long)sVar5 < 0) {
        iVar6 = 5;
        if (local_a8 == CURLE_AGAIN) {
          local_a8 = CURLE_OK;
          sVar5 = 0;
          goto LAB_001147e1;
        }
      }
      else {
LAB_001147e1:
        Curl_dyn_tail(s,len - sVar5);
        sVar5 = Curl_dyn_len(s);
        iVar6 = 0;
        if (sVar5 != 0) {
          local_a8 = CURLE_OK;
          iVar6 = 5;
        }
      }
      if (iVar6 == 5) goto LAB_0011482b;
      if (iVar6 != 0) {
        return (CURLcode)sVar5;
      }
    }
    *piVar1 = 2;
    CVar3 = local_a8;
  }
  else if (*piVar1 == 0) {
    pvVar2 = cf->ctx;
    if (cf->conn->unix_domain_socket == (char *)0x0) {
      CVar3 = Curl_conn_cf_get_ip_info(cf->next,data,&local_a4,&local_94);
      if (CVar3 == CURLE_OK) {
        pcVar4 = (data->set).str[0x45];
        if (pcVar4 == (char *)0x0) {
          pcVar4 = local_94.local_ip;
        }
        pcVar7 = "TCP6";
        if (local_a4 == 0) {
          pcVar7 = "TCP4";
        }
        CVar3 = Curl_dyn_addf((dynbuf *)((long)pvVar2 + 8),"PROXY %s %s %s %i %i\r\n",pcVar7,pcVar4,
                              &local_94,(ulong)(uint)local_94.local_port,local_94.remote_port);
      }
    }
    else {
      CVar3 = Curl_dyn_addn((dynbuf *)((long)pvVar2 + 8),"PROXY UNKNOWN\r\n",0xf);
    }
    local_a8 = CVar3;
    if (CVar3 != CURLE_OK) goto LAB_0011482b;
    *piVar1 = 1;
    goto LAB_00114782;
  }
  local_a8 = CVar3;
  Curl_dyn_free((dynbuf *)(piVar1 + 2));
LAB_0011482b:
  if (local_a8 == CURLE_OK) {
    _Var8 = *piVar1 == 2;
  }
  else {
    _Var8 = false;
  }
  *done = _Var8;
  cf->field_0x24 = cf->field_0x24 & 0xfe | _Var8;
  return local_a8;
}

Assistant:

static CURLcode cf_haproxy_connect(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   bool blocking, bool *done)
{
  struct cf_haproxy_ctx *ctx = cf->ctx;
  CURLcode result;
  size_t len;

  DEBUGASSERT(ctx);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  switch(ctx->state) {
  case HAPROXY_INIT:
    result = cf_haproxy_date_out_set(cf, data);
    if(result)
      goto out;
    ctx->state = HAPROXY_SEND;
    FALLTHROUGH();
  case HAPROXY_SEND:
    len = Curl_dyn_len(&ctx->data_out);
    if(len > 0) {
      ssize_t nwritten;
      nwritten = Curl_conn_cf_send(cf->next, data,
                                   Curl_dyn_ptr(&ctx->data_out), len, FALSE,
                                   &result);
      if(nwritten < 0) {
        if(result != CURLE_AGAIN)
          goto out;
        result = CURLE_OK;
        nwritten = 0;
      }
      Curl_dyn_tail(&ctx->data_out, len - (size_t)nwritten);
      if(Curl_dyn_len(&ctx->data_out) > 0) {
        result = CURLE_OK;
        goto out;
      }
    }
    ctx->state = HAPROXY_DONE;
    FALLTHROUGH();
  default:
    Curl_dyn_free(&ctx->data_out);
    break;
  }

out:
  *done = (!result) && (ctx->state == HAPROXY_DONE);
  cf->connected = *done;
  return result;
}